

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O0

long __thiscall
glcts::anon_unknown_0::SubroutineIndexNegativeLinkMaxNumOfIndices::Run
          (SubroutineIndexNegativeLinkMaxNumOfIndices *this)

{
  long lVar1;
  LayoutSpecifierBase _index;
  LayoutSpecifier<glcts::(anonymous_namespace)::IndexSpecifier> _index_00;
  DefOccurence local_474;
  LayoutSpecifierBase local_470;
  LayoutSpecifierBase local_460;
  SubroutineUniform local_450;
  undefined1 local_2e8 [8];
  vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
  subroutineUniforms;
  SubroutineFunction local_2a0;
  LayoutSpecifierBase local_198;
  LayoutSpecifierBase local_188;
  LayoutSpecifierBase local_178;
  SubroutineFunction local_168;
  int local_60;
  int i;
  int local_4c;
  undefined1 local_48 [4];
  GLint max;
  SubroutineFunctionSet functions_st0;
  SubroutineIndexNegativeLinkMaxNumOfIndices *this_local;
  
  functions_st0.typeName.field_2._8_8_ = this;
  SubroutineFunctionSet::SubroutineFunctionSet
            ((SubroutineFunctionSet *)local_48,
             &(this->super_ExplicitUniformLocationCaseBase).uniformValueGenerator,0);
  glu::CallLogWrapper::glGetIntegerv
            (&(this->super_ExplicitUniformLocationCaseBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x8de7,&local_4c);
  for (local_60 = 0; local_60 < local_4c; local_60 = local_60 + 1) {
    _index = (LayoutSpecifierBase)
             LayoutSpecifier<glcts::(anonymous_namespace)::IndexSpecifier>::C(local_60,Dec);
    local_198 = _index;
    local_188 = _index;
    local_178 = _index;
    SubroutineFunction::SubroutineFunction
              (&local_168,&(this->super_ExplicitUniformLocationCaseBase).uniformValueGenerator,
               (Index)_index);
    SubroutineFunctionSet::push_back((SubroutineFunctionSet *)local_48,&local_168);
    SubroutineFunction::~SubroutineFunction(&local_168);
  }
  _index_00 = LayoutSpecifier<glcts::(anonymous_namespace)::IndexSpecifier>::Implicit();
  subroutineUniforms.
  super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = _index_00.super_LayoutSpecifierBase._0_8_;
  SubroutineFunction::SubroutineFunction
            (&local_2a0,&(this->super_ExplicitUniformLocationCaseBase).uniformValueGenerator,
             (Index)_index_00.super_LayoutSpecifierBase);
  SubroutineFunctionSet::push_back((SubroutineFunctionSet *)local_48,&local_2a0);
  SubroutineFunction::~SubroutineFunction(&local_2a0);
  std::
  vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
  ::vector((vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
            *)local_2e8);
  local_470 = (LayoutSpecifierBase)
              LayoutSpecifier<glcts::(anonymous_namespace)::LocationSpecifier>::Implicit();
  local_460 = local_470;
  DefOccurence::DefOccurence(&local_474,FSH_OR_CSH);
  SubroutineUniform::SubroutineUniform
            (&local_450,&(this->super_ExplicitUniformLocationCaseBase).uniformValueGenerator,
             (SubroutineFunctionSet *)local_48,(Loc)local_460,0,local_474,true);
  std::
  vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
  ::push_back((vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
               *)local_2e8,&local_450);
  SubroutineUniform::~SubroutineUniform(&local_450);
  lVar1 = ExplicitUniformLocationCaseBase::doRunNegativeLink
                    (&this->super_ExplicitUniformLocationCaseBase,
                     (vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
                      *)local_2e8);
  std::
  vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
  ::~vector((vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
             *)local_2e8);
  SubroutineFunctionSet::~SubroutineFunctionSet((SubroutineFunctionSet *)local_48);
  return lVar1;
}

Assistant:

virtual long Run()
	{
		//subroutine vec4 st0(float param);
		SubroutineFunctionSet functions_st0(uniformValueGenerator);

		glw::GLint max;
		glGetIntegerv(GL_MAX_SUBROUTINES, &max);

		for (int i = 0; i < max; i++)
		{
			//layout(index = N) subroutine(st0) vec4 sf0(float param) { .... };
			functions_st0.push_back(SubroutineFunction(uniformValueGenerator, Index::C(i)));
		}
		functions_st0.push_back(SubroutineFunction(uniformValueGenerator, Index::Implicit()));

		std::vector<SubroutineUniform> subroutineUniforms;

		//subroutine uniform st0 u0;
		subroutineUniforms.push_back(
			SubroutineUniform(uniformValueGenerator, functions_st0, Loc::Implicit(), 0, DefOccurence::FSH_OR_CSH));
		return doRunNegativeLink(subroutineUniforms);
	}